

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soac.cpp
# Opt level: O1

string * __thiscall Member::GetType_abi_cxx11_(string *__return_storage_ptr__,Member *this)

{
  int iVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (this->isConst == true) {
    std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,(char *)0x0,0x108557);
  }
  std::__cxx11::string::_M_append
            ((char *)__return_storage_ptr__,(ulong)(this->type)._M_dataplus._M_p);
  if (0 < this->numPointers) {
    iVar1 = 0;
    do {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      iVar1 = iVar1 + 1;
    } while (iVar1 < this->numPointers);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GetType() const {
        std::string s;
        if (isConst)
            s = "const ";
        s += type;
        for (int i = 0; i < numPointers; ++i)
            s += "*";
        return s;
    }